

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void gai_print_subscript(char *pre,int ndim,Integer *subscript,char *post)

{
  ulong uVar1;
  
  printf("%s [",pre);
  if (0 < ndim) {
    uVar1 = 0;
    do {
      printf("%ld",subscript[uVar1]);
      if (ndim - 1 == uVar1) {
        printf("] %s",post);
      }
      else {
        putchar(0x2c);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)ndim != uVar1);
  }
  return;
}

Assistant:

void gai_print_subscript(char *pre,int ndim, Integer subscript[], char* post)
{
        int i;

        printf("%s [",pre);
        for(i=0;i<ndim;i++){
                printf("%ld",(long)subscript[i]);
                if(i==ndim-1)printf("] %s",post);
                else printf(",");
        }
}